

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O2

Var Js::AtomicsObject::EntryStore(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Var index;
  TypedArrayBase *pTVar8;
  undefined4 extraout_var;
  int in_stack_00000010;
  undefined1 local_48 [8];
  ArgumentReader args;
  CallInfo CStack_30;
  uint32 accessIndex;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  CStack_30 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xa2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00a044e3;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,&stack0xffffffffffffffd0,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)CStack_30 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xa2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00a044e3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((local_48._0_4_ & 0xfffffc) != 0) {
    args.super_Arguments.Values._4_4_ = 0;
    pvVar7 = Arguments::operator[]((Arguments *)local_48,1);
    index = Arguments::operator[]((Arguments *)local_48,2);
    pTVar8 = ValidateAndGetTypedArray
                       (pvVar7,index,(uint32 *)((long)&args.super_Arguments.Values + 4),pSVar1,false
                       );
    uVar3 = args.super_Arguments.Values._4_4_;
    pvVar7 = Arguments::operator[]((Arguments *)local_48,3);
    iVar5 = (*(pTVar8->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x79])(pTVar8,(ulong)uVar3,pvVar7);
    return (Var)CONCAT44(extraout_var,iVar5);
  }
  JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec12,L"Atomics.store");
}

Assistant:

Var AtomicsObject::EntryStore(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(3, "Atomics.store");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext);
        return typedArrayBase->TypedStore(accessIndex, args[3]);
    }